

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

int deSocketFamilyToBsdFamily(deSocketFamily family)

{
  undefined4 local_c;
  deSocketFamily family_local;
  
  if (family == DE_SOCKETFAMILY_INET4) {
    local_c = 2;
  }
  else if (family == DE_SOCKETFAMILY_INET6) {
    local_c = 10;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int deSocketFamilyToBsdFamily (deSocketFamily family)
{
	switch (family)
	{
		case DE_SOCKETFAMILY_INET4:	return AF_INET;
		case DE_SOCKETFAMILY_INET6:	return AF_INET6;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}